

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_check.c
# Opt level: O0

int check_logical_error_hz(mod2sparse *h,char *orig_error,char *decoding)

{
  int iVar1;
  int iVar2;
  mod2sparse *m;
  mod2sparse *r;
  mod2sparse *m_00;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  int rank_htf;
  int rank_ht;
  mod2sparse *htf;
  mod2sparse *ht;
  char *residual;
  int c;
  int n;
  int logical_error;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined8 in_stack_ffffffffffffffc0;
  uint local_1c;
  
  iVar1 = *(int *)(in_RDI + 4);
  m = (mod2sparse *)
      chk_alloc((uint)((ulong)in_stack_ffffffffffffffc0 >> 0x20),(uint)in_stack_ffffffffffffffc0);
  bin_char_add(in_RSI,in_RDX,(char *)m,iVar1);
  r = mod2sparse_allocate((int)((ulong)m >> 0x20),(int)m);
  mod2sparse_transpose(m,r);
  m_00 = mod2sparse_allocate((int)((ulong)m >> 0x20),(int)m);
  mod2sparse_merge_vec
            (m,(char *)r,(int)((ulong)m_00 >> 0x20),
             (mod2sparse *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  iVar1 = mod2sparse_rank(ht);
  iVar2 = mod2sparse_rank(ht);
  local_1c = (uint)(iVar1 < iVar2);
  free(m);
  mod2sparse_free(m_00);
  mod2sparse_free(m_00);
  return local_1c;
}

Assistant:

int check_logical_error_hz(mod2sparse* h,char *orig_error,char *decoding){

    int logical_error = 0;

    int n = mod2sparse_cols(h);
    int c = mod2sparse_rows(h);

    char *residual=chk_alloc(n,sizeof(*residual));

    bin_char_add(orig_error,decoding,residual,n);

    mod2sparse *ht = mod2sparse_allocate(n,c);
    mod2sparse_transpose(h,ht);

    mod2sparse *htf = mod2sparse_allocate(n,n);

    mod2sparse_merge_vec(ht, residual, n, htf);

    int rank_ht = mod2sparse_rank(h); //we have rank(A^T) = rank(A)

    int rank_htf = mod2sparse_rank(htf);

    if (rank_ht < rank_htf) {
        logical_error = 1;
    }

    free(residual);

    mod2sparse_free(ht);
    mod2sparse_free(htf);

    return logical_error;

}